

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O2

void __thiscall
ExchangeCompilation_MissingDefinitions_Test::TestBody
          (ExchangeCompilation_MissingDefinitions_Test *this)

{
  parser<pstore::exchange::import_ns::callbacks> *ppVar1;
  char *message;
  char *in_R9;
  database *db;
  error_code eVar2;
  mock_mutex mutex;
  error_code local_2b8;
  coord local_2a8;
  AssertHelper local_2a0;
  AssertionResult gtest_ar_;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragment_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> names;
  digest compilation_digest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> compilation;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  parser<pstore::exchange::import_ns::callbacks> name_parser;
  string_mapping imported_names;
  parser<pstore::exchange::import_ns::callbacks> compilation_parser;
  
  s_abi_cxx11_(&names,"[ \"triple\" ]",0xc);
  s_abi_cxx11_(&compilation,"{ \"triple\": 0 }",0xf);
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.strings_;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.views_;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  compilation_digest.v_._0_8_ = 0x9abcdef0;
  compilation_digest.v_._8_8_ = 0x12345678;
  imported_names.lookup_._M_h._M_buckets = &imported_names.lookup_._M_h._M_single_bucket;
  imported_names.lookup_._M_h._M_bucket_count = 1;
  imported_names.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  imported_names.lookup_._M_h._M_element_count = 0;
  imported_names.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  imported_names.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  imported_names.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&name_parser,&mutex);
  db = &(this->super_ExchangeCompilation).import_db_;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,db,(lock_type *)&name_parser);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&name_parser);
  anon_unknown.dwarf_9d963::import_strings_parser(&name_parser,&transaction,&imported_names);
  ppVar1 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input(&name_parser,&names);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = name_parser.error_._M_value == 0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pstore::index::
    get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
              ((index *)&fragment_index,db,true);
    anon_unknown.dwarf_9d963::import_compilation_parser
              (&compilation_parser,&transaction,&imported_names,&fragment_index,&compilation_digest)
    ;
    ppVar1 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                       (&compilation_parser,&compilation);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar1);
    eVar2 = pstore::exchange::import_ns::make_error_code(incomplete_compilation_object);
    local_2b8._M_cat = eVar2._M_cat;
    local_2b8._M_value = eVar2._M_value;
    testing::internal::CmpHelperEQ<std::error_code,std::error_code>
              ((internal *)&gtest_ar_,"compilation_parser.last_error ()",
               "make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object)"
               ,&compilation_parser.error_,&local_2b8);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_2b8);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_2a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                 ,0x16a,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a8,(Message *)&local_2b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
      if ((long *)CONCAT44(local_2b8._4_4_,local_2b8._M_value) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_2b8._4_4_,local_2b8._M_value) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pstore::transaction_base::commit(&transaction.super_transaction_base);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&compilation_parser);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&fragment_index.
                super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    testing::Message::Message((Message *)&local_2b8);
    std::operator<<((ostream *)(CONCAT44(local_2b8._4_4_,local_2b8._M_value) + 0x10),
                    "JSON error was: ");
    (**(code **)(*(long *)name_parser.error_._M_cat + 0x20))
              (&compilation_parser,name_parser.error_._M_cat,name_parser.error_._M_value);
    std::operator<<((ostream *)(CONCAT44(local_2b8._4_4_,local_2b8._M_value) + 0x10),
                    (string *)&compilation_parser);
    std::operator<<((ostream *)(CONCAT44(local_2b8._4_4_,local_2b8._M_value) + 0x10),' ');
    local_2a8 = name_parser.coordinate_;
    pstore::json::operator<<
              ((ostream *)(CONCAT44(local_2b8._4_4_,local_2b8._M_value) + 0x10),&local_2a8);
    std::operator<<((ostream *)(CONCAT44(local_2b8._4_4_,local_2b8._M_value) + 0x10),'\n');
    std::operator<<((ostream *)(CONCAT44(local_2b8._4_4_,local_2b8._M_value) + 0x10),
                    (string *)&names);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&fragment_index,(internal *)&gtest_ar_,
               (AssertionResult *)"name_parser.has_error ()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0x15f,(char *)fragment_index.
                              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    std::__cxx11::string::~string((string *)&fragment_index);
    std::__cxx11::string::~string((string *)&compilation_parser);
    if ((long *)CONCAT44(local_2b8._4_4_,local_2b8._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_2b8._4_4_,local_2b8._M_value) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&name_parser);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&transaction);
  pstore::exchange::import_ns::string_mapping::~string_mapping(&imported_names);
  std::__cxx11::string::~string((string *)&compilation);
  std::__cxx11::string::~string((string *)&names);
  return;
}

Assistant:

TEST_F (ExchangeCompilation, MissingDefinitions) {
    auto const names = R"([ "triple" ])"s;
    auto const compilation = R"({ "triple": 0 })"s;
    constexpr auto compilation_digest = pstore::index::digest{0x12345678, 0x9ABCDEF0};

    pstore::exchange::import_ns::string_mapping imported_names;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});
    auto name_parser = import_strings_parser (&transaction, &imported_names);
    name_parser.input (names).eof ();
    ASSERT_FALSE (name_parser.has_error ())
        << "JSON error was: " << name_parser.last_error ().message () << ' '
        << name_parser.coordinate () << '\n'
        << names;

    auto const fragment_index =
        pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
    auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                         fragment_index, compilation_digest);
    compilation_parser.input (compilation).eof ();
    EXPECT_EQ (compilation_parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object));

    transaction.commit ();
}